

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerSettings.cpp
# Opt level: O2

bool __thiscall HdmiCecAnalyzerSettings::SetSettingsFromInterfaces(HdmiCecAnalyzerSettings *this)

{
  char *pcVar1;
  Channel aCStack_28 [16];
  
  AnalyzerSettingInterfaceChannel::GetChannel();
  Channel::operator=(&this->mCecChannel,aCStack_28);
  Channel::~Channel(aCStack_28);
  AnalyzerSettings::ClearChannels();
  pcVar1 = HdmiCec::GetProtocolName();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mCecChannel,SUB81(pcVar1,0));
  return true;
}

Assistant:

bool HdmiCecAnalyzerSettings::SetSettingsFromInterfaces()
{
    mCecChannel = mCecChannelInterface->GetChannel();

    ClearChannels();
    AddChannel( mCecChannel, HdmiCec::GetProtocolName(), true );

    return true;
}